

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|
          (CharClass<char> *__return_storage_ptr__,CharClass<char> *this,Range<char> *r)

{
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *this_00;
  byte bVar1;
  byte bVar2;
  pointer pRVar3;
  pointer pRVar4;
  byte bVar5;
  byte bVar6;
  pointer pRVar7;
  
  this_00 = &__return_storage_ptr__->m_ranges;
  __return_storage_ptr__->_vptr_CharClass = (_func_int **)&PTR__CharClass_0019e088;
  (__return_storage_ptr__->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pRVar7 = pRVar3;
  if (pRVar3 != pRVar4) {
    do {
      if (((byte)pRVar7->m_start <= (byte)r->m_end) && ((byte)r->m_start <= (byte)pRVar7->m_end))
      break;
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar4);
  }
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)this_00,0,
             pRVar3,pRVar7);
  if (pRVar7 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = r->m_start;
    bVar5 = r->m_end;
    do {
      bVar1 = pRVar7->m_start;
      if ((bVar5 < bVar1) || (bVar2 = pRVar7->m_end, bVar2 < bVar6)) break;
      if (bVar1 < bVar6) {
        bVar6 = bVar1;
      }
      if (bVar2 < bVar5) {
        bVar2 = bVar5;
      }
      bVar5 = bVar2;
      pRVar7 = pRVar7 + 1;
      r->m_start = bVar6;
      r->m_end = bVar5;
    } while (pRVar7 != (this->m_ranges).
                       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::push_back
            (this_00,r);
  std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<char>const*,std::vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>>>>
            ((vector<Centaurus::Range<char>,std::allocator<Centaurus::Range<char>>> *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish,pRVar7,
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator|(Range<TCHAR> r) const
    {
        CharClass<TCHAR> cc;

        auto i = m_ranges.cbegin();

        for (; i != m_ranges.cend() && !i->overlaps(r); i++)
            ;
        
        cc.m_ranges.insert(cc.m_ranges.end(), m_ranges.cbegin(), i);

        for (; i != m_ranges.cend() && i->overlaps(r); i++)
        {
            r = r.merge(*i);
        }

        cc.m_ranges.push_back(r);

        cc.m_ranges.insert(cc.m_ranges.end(), i, m_ranges.cend());

        return cc;
    }